

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsDemuxer.cpp
# Opt level: O1

bool __thiscall TSDemuxer::checkForRealM2ts(TSDemuxer *this,uint8_t *buffer,uint8_t *end)

{
  uint8_t *puVar1;
  uint8_t uVar2;
  ostream *poVar3;
  uint8_t *puVar4;
  bool bVar5;
  
  bVar5 = buffer < end;
  if (bVar5) {
    if (buffer[4] == 'G') {
      puVar4 = buffer + 0xc0;
      do {
        bVar5 = puVar4 < end;
        if (!bVar5) goto LAB_001d6bb3;
        puVar1 = puVar4 + 4;
        puVar4 = puVar4 + 0xc0;
      } while (*puVar1 == 'G');
    }
    if (bVar5) {
      return false;
    }
  }
LAB_001d6bb3:
  bVar5 = buffer < end;
  if (bVar5) {
    if (*buffer == 'G') {
      puVar4 = buffer + 0xbc;
      do {
        bVar5 = puVar4 < end;
        if (!bVar5) {
          return bVar5;
        }
        uVar2 = *puVar4;
        puVar4 = puVar4 + 0xbc;
      } while (uVar2 == 'G');
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Warning! The file ",0x12);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->m_streamName)._M_dataplus._M_p,
                        (this->m_streamName)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," has a M2TS format.",0x13);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    sLastMsg = true;
  }
  return bVar5;
}

Assistant:

bool TSDemuxer::checkForRealM2ts(const uint8_t* buffer, const uint8_t* end) const
{
    for (const uint8_t* cur = buffer; cur < end; cur += 192)
        if (cur[4] != 0x47)
            return false;
    for (const uint8_t* cur = buffer; cur < end; cur += 188)
        if (*cur != 0x47)
        {
            LTRACE(LT_WARN, 2, "Warning! The file " << m_streamName << " has a M2TS format.");
            return true;
        }
    return false;
}